

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qapplication.cpp
# Opt level: O2

void __thiscall QApplicationPrivate::notifyWindowIconChanged(QApplicationPrivate *this)

{
  QWidget *this_00;
  QWidget **ppQVar1;
  long lVar2;
  long lVar3;
  int i;
  undefined1 *puVar4;
  long in_FS_OFFSET;
  QWindow *local_90;
  QArrayDataPointer<QWindow_*> local_88;
  QArrayDataPointer<QWidget_*> local_68;
  undefined1 *local_48;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  QEvent::QEvent((QEvent *)&local_48,ApplicationWindowIconChange);
  local_68.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_68.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_68.ptr = (QWidget **)&DAT_aaaaaaaaaaaaaaaa;
  QApplication::topLevelWidgets();
  local_88.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_88.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_88.ptr = (QWindow **)&DAT_aaaaaaaaaaaaaaaa;
  QGuiApplication::topLevelWindows();
  ppQVar1 = local_68.ptr;
  lVar3 = local_68.size << 3;
  for (lVar2 = 0; lVar3 != lVar2; lVar2 = lVar2 + 8) {
    this_00 = *(QWidget **)((long)ppQVar1 + lVar2);
    local_90 = QWidget::windowHandle(this_00);
    QtPrivate::sequential_erase_one<QList<QWindow*>,QWindow*>
              ((QList<QWindow_*> *)&local_88,&local_90);
    QCoreApplication::sendEvent(&this_00->super_QObject,(QEvent *)&local_48);
  }
  for (puVar4 = (undefined1 *)0x0; puVar4 < (ulong)local_88.size; puVar4 = puVar4 + 1) {
    QCoreApplication::sendEvent((QObject *)local_88.ptr[(long)puVar4],(QEvent *)&local_48);
  }
  QArrayDataPointer<QWindow_*>::~QArrayDataPointer(&local_88);
  QArrayDataPointer<QWidget_*>::~QArrayDataPointer(&local_68);
  QEvent::~QEvent((QEvent *)&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QApplicationPrivate::notifyWindowIconChanged()
{
    QEvent ev(QEvent::ApplicationWindowIconChange);
    const QWidgetList list = QApplication::topLevelWidgets();
    QWindowList windowList = QGuiApplication::topLevelWindows();

    // send to all top-level QWidgets
    for (auto *w : list) {
        windowList.removeOne(w->windowHandle());
        QCoreApplication::sendEvent(w, &ev);
    }

    // in case there are any plain QWindows in this QApplication-using
    // application, also send the notification to them
    for (int i = 0; i < windowList.size(); ++i)
        QCoreApplication::sendEvent(windowList.at(i), &ev);
}